

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double<double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          double value,format_specs *spec)

{
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  alignment aVar4;
  align_spec *in_RSI;
  double in_XMM0_Qa;
  type *it;
  align_spec as;
  size_t n;
  format_specs normalized_spec;
  bool use_grisu;
  memory_buffer buffer;
  write_inf_or_nan_t write_inf_or_nan;
  char sign;
  float_spec_handler handler;
  float_spec_handler *in_stack_fffffffffffffcf8;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  write_inf_or_nan_t *in_stack_fffffffffffffd10;
  char *this_00;
  allocator<char> local_2d9;
  buffer *in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd39;
  core_format_specs in_stack_fffffffffffffd40;
  undefined1 *local_2b8;
  double_writer *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  alignment aVar5;
  allocator<char> local_259;
  basic_buffer<char> local_258 [17];
  undefined8 local_38;
  undefined8 local_30;
  undefined2 local_28;
  allocator<char> local_24;
  allocator<char> local_1b;
  float_spec_handler local_1a;
  align_spec *local_18;
  double local_10;
  
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  float_spec_handler::float_spec_handler(&local_1a,*(char *)((long)&in_RSI[1].fill_ + 1));
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>
            ((char)((ulong)in_stack_fffffffffffffd00 >> 0x38),in_stack_fffffffffffffcf8);
  local_1b = (allocator<char>)0x0;
  bVar3 = std::signbit(local_10);
  if (bVar3) {
    local_1b = (allocator<char>)0x2d;
    local_10 = -local_10;
  }
  else {
    bVar3 = core_format_specs::has((core_format_specs *)(local_18 + 1),1);
    if (bVar3) {
      bVar3 = core_format_specs::has((core_format_specs *)(local_18 + 1),2);
      local_2d9 = (allocator<char>)0x2b;
      if (!bVar3) {
        local_2d9 = (allocator<char>)0x20;
      }
      local_1b = local_2d9;
    }
  }
  local_38._0_4_ = local_18->width_;
  local_38._4_4_ = local_18->fill_;
  local_30 = *(undefined8 *)&local_18->align_;
  local_28 = (undefined2)local_18[1].fill_;
  local_24 = local_1b;
  bVar3 = std::numeric_limits<fmt::v5::internal::dummy_int>::isnotanumber<double>
                    ((double)in_stack_fffffffffffffcf8);
  if (bVar3) {
    write_double<double>::write_inf_or_nan_t::operator()
              (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  }
  else {
    bVar3 = std::numeric_limits<fmt::v5::internal::dummy_int>::isinfinity<double>
                      ((double)in_stack_fffffffffffffcf8);
    if (bVar3) {
      if ((local_1a.upper & 1U) == 0) {
        this_00 = "inf";
      }
      else {
        this_00 = "INF";
      }
      write_double<double>::write_inf_or_nan_t::operator()
                ((write_inf_or_nan_t *)this_00,in_stack_fffffffffffffd08);
    }
    else {
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                (in_stack_fffffffffffffd00,(allocator<char> *)in_stack_fffffffffffffcf8);
      std::allocator<char>::~allocator(&local_259);
      internal::sprintf_format<double>
                ((double)CONCAT71(in_stack_fffffffffffffd39,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30,in_stack_fffffffffffffd40);
      internal::basic_buffer<char>::size(local_258);
      iVar1 = local_18->width_;
      uVar2 = local_18->fill_;
      aVar5 = local_18->align_;
      aVar4 = align_spec::align(local_18);
      if (aVar4 == ALIGN_NUMERIC) {
        if (local_1b != (allocator<char>)0x0) {
          in_stack_fffffffffffffd00 =
               (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               reserve((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                        *)in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8);
          in_stack_fffffffffffffd50 = (double_writer *)&local_2b8;
          local_2b8 = &in_stack_fffffffffffffd00->field_0x1;
          in_stack_fffffffffffffd00->super_allocator<char> = local_1b;
          local_1b = (allocator<char>)0x0;
          if (iVar1 != 0) {
            iVar1 = iVar1 + -1;
          }
        }
        aVar5 = ALIGN_RIGHT;
      }
      else {
        aVar4 = align_spec::align(local_18);
        if (aVar4 == ALIGN_DEFAULT) {
          aVar5 = ALIGN_RIGHT;
        }
      }
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
      write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
                ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                  *)CONCAT44(aVar5,uVar2),(align_spec *)CONCAT44(iVar1,in_stack_fffffffffffffd58),
                 in_stack_fffffffffffffd50);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                (in_stack_fffffffffffffd00);
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}